

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writeincludesbase.cpp
# Opt level: O1

void __thiscall
WriteIncludesBase::add(WriteIncludesBase *this,QString *className,DomCustomWidget *dcw)

{
  Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *this_00;
  bool bVar1;
  char cVar2;
  Node<QString,_QHashDummyValue> *pNVar3;
  CustomWidgetsInfo *this_01;
  long in_FS_OFFSET;
  QStringView QVar4;
  QAnyStringView baseClassName;
  QStringView QVar5;
  QAnyStringView baseClassName_00;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((className->d).size != 0) {
    this_00 = (this->m_knownClasses).q_hash.d;
    if (this_00 != (Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)0x0) {
      pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QString,_QHashDummyValue>_>::findNode<QString>
                         (this_00,className);
      if (pNVar3 != (Node<QString,_QHashDummyValue> *)0x0) goto LAB_00154321;
    }
    QHash<QString,QHashDummyValue>::emplace<QHashDummyValue_const&>
              ((QHash<QString,QHashDummyValue> *)&this->m_knownClasses,className,
               (QHashDummyValue *)&local_48);
    this_01 = &this->m_uic->cWidgetsInfo;
    if (add(QString_const&,DomCustomWidget_const*)::treeViewsWithHeaders == '\0') {
      add();
    }
    bVar1 = CustomWidgetsInfo::extendsOneOf(this_01,className,&add::treeViewsWithHeaders);
    if (bVar1) {
      local_48.d.d = (Data *)0x0;
      local_48.d.ptr = L"QHeaderView";
      local_48.d.size = 0xb;
      add(this,&local_48,(DomCustomWidget *)0x0);
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if (this->m_laidOut == false) {
      baseClassName.m_size = 8;
      baseClassName.field_0.m_data_utf8 = "QToolBox";
      bVar1 = CustomWidgetsInfo::extends(this_01,className,baseClassName);
      if (bVar1) {
        local_48.d.d = (Data *)0x0;
        local_48.d.ptr = L"QLayout";
        local_48.d.size = 7;
        add(this,&local_48,(DomCustomWidget *)0x0);
        if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
    }
    if ((className->d).size == 4) {
      QVar4.m_data = (className->d).ptr;
      QVar4.m_size = 4;
      QVar5.m_data = L"Line";
      QVar5.m_size = 4;
      cVar2 = QtPrivate::equalStrings(QVar4,QVar5);
      if (cVar2 != '\0') {
        local_48.d.d = (Data *)0x0;
        local_48.d.ptr = L"QFrame";
        local_48.d.size = 6;
        add(this,&local_48,(DomCustomWidget *)0x0);
        if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
          }
        }
        goto LAB_00154321;
      }
    }
    baseClassName_00.m_size = 0x10;
    baseClassName_00.field_0.m_data_utf8 = "QDialogButtonBox";
    bVar1 = CustomWidgetsInfo::extends(this_01,className,baseClassName_00);
    if (bVar1) {
      local_48.d.d = (Data *)0x0;
      local_48.d.ptr = L"QAbstractButton";
      local_48.d.size = 0xf;
      add(this,&local_48,(DomCustomWidget *)0x0);
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    (*(this->super_TreeWalker)._vptr_TreeWalker[0x23])(this,className,dcw);
  }
LAB_00154321:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteIncludesBase::add(const QString &className, const DomCustomWidget *dcw)
{
    if (className.isEmpty() || m_knownClasses.contains(className))
        return;

    m_knownClasses.insert(className);

    const CustomWidgetsInfo *cwi = m_uic->customWidgetsInfo();
    static const QStringList treeViewsWithHeaders = {
        QStringLiteral("QTreeView"), QStringLiteral("QTreeWidget"),
        QStringLiteral("QTableView"), QStringLiteral("QTableWidget")
    };
    if (cwi->extendsOneOf(className, treeViewsWithHeaders))
        add(QStringLiteral("QHeaderView"));

    if (!m_laidOut && cwi->extends(className, "QToolBox"))
        add(QStringLiteral("QLayout")); // spacing property of QToolBox)

    if (className == QStringLiteral("Line")) { // ### hmm, deprecate me!
        add(QStringLiteral("QFrame"));
        return;
    }

    if (cwi->extends(className, "QDialogButtonBox"))
        add(QStringLiteral("QAbstractButton")); // for signal "clicked(QAbstractButton*)"

    doAdd(className, dcw);
}